

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::polygon_mode_is_supported(Impl *this,VkPolygonMode mode)

{
  size_type sVar1;
  bool bVar2;
  allocator local_31;
  key_type local_30;
  
  if (mode - VK_POLYGON_MODE_LINE < 2) {
    bVar2 = (this->features2).features.fillModeNonSolid == 1;
  }
  else if (mode == VK_POLYGON_MODE_FILL) {
    bVar2 = true;
  }
  else if (mode == VK_POLYGON_MODE_FILL_RECTANGLE_NV) {
    std::__cxx11::string::string((string *)&local_30,"VK_NV_fill_rectangle",&local_31);
    sVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_30);
    bVar2 = sVar1 != 0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FeatureFilter::Impl::polygon_mode_is_supported(VkPolygonMode mode) const
{
	switch (mode)
	{
	case VK_POLYGON_MODE_FILL:
		return true;

	case VK_POLYGON_MODE_POINT:
	case VK_POLYGON_MODE_LINE:
		return features2.features.fillModeNonSolid == VK_TRUE;

	case VK_POLYGON_MODE_FILL_RECTANGLE_NV:
		return enabled_extensions.count(VK_NV_FILL_RECTANGLE_EXTENSION_NAME) != 0;

	default:
		return false;
	}
}